

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifUtil.c
# Opt level: O0

float If_ManMarkMapping_rec(If_Man_t *p,If_Obj_t *pObj)

{
  int iVar1;
  If_Cut_t *pCut;
  bool bVar2;
  float fVar3;
  int *local_48;
  int local_40;
  float local_3c;
  int i;
  float aArea;
  float *pSwitching;
  If_Cut_t *pCutBest;
  If_Obj_t *pLeaf;
  If_Obj_t *pObj_local;
  If_Man_t *p_local;
  
  if (p->vSwitching == (Vec_Int_t *)0x0) {
    local_48 = (int *)0x0;
  }
  else {
    local_48 = p->vSwitching->pArray;
  }
  iVar1 = pObj->nRefs;
  pObj->nRefs = iVar1 + 1;
  if (((iVar1 == 0) && (iVar1 = If_ObjIsCi(pObj), iVar1 == 0)) &&
     (iVar1 = If_ObjIsConst1(pObj), iVar1 == 0)) {
    iVar1 = If_ObjIsAnd(pObj);
    if (iVar1 != 0) {
      pCut = If_ObjCutBest(pObj);
      p->nNets = (*(uint *)&pCut->field_0x1c >> 0x18) + p->nNets;
      local_3c = If_CutLutArea(p,pCut);
      local_40 = 0;
      while( true ) {
        bVar2 = false;
        if (local_40 < (int)(*(uint *)&pCut->field_0x1c >> 0x18)) {
          pCutBest = (If_Cut_t *)If_ManObj(p,(int)(&pCut[1].Area)[local_40]);
          bVar2 = (If_Obj_t *)pCutBest != (If_Obj_t *)0x0;
        }
        if (!bVar2) break;
        if (local_48 == (int *)0x0) {
          fVar3 = 0.0;
        }
        else {
          fVar3 = (float)local_48[(int)pCutBest->Edge];
        }
        p->dPower = p->dPower + fVar3;
        fVar3 = If_ManMarkMapping_rec(p,(If_Obj_t *)pCutBest);
        local_3c = fVar3 + local_3c;
        local_40 = local_40 + 1;
      }
      return local_3c;
    }
    __assert_fail("If_ObjIsAnd(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifUtil.c"
                  ,0x19a,"float If_ManMarkMapping_rec(If_Man_t *, If_Obj_t *)");
  }
  return 0.0;
}

Assistant:

float If_ManMarkMapping_rec( If_Man_t * p, If_Obj_t * pObj )
{
    If_Obj_t * pLeaf;
    If_Cut_t * pCutBest;
    float * pSwitching = p->vSwitching? (float*)p->vSwitching->pArray : NULL;
    float aArea;
    int i;
    if ( pObj->nRefs++ || If_ObjIsCi(pObj) || If_ObjIsConst1(pObj) )
        return 0.0;
    // store the node in the structure by level
    assert( If_ObjIsAnd(pObj) );
    // visit the transitive fanin of the selected cut
    pCutBest = If_ObjCutBest(pObj);
    p->nNets += pCutBest->nLeaves;
    aArea = If_CutLutArea( p, pCutBest );
    If_CutForEachLeaf( p, pCutBest, pLeaf, i )
    {
        p->dPower += pSwitching? pSwitching[pLeaf->Id] : 0.0;
        aArea += If_ManMarkMapping_rec( p, pLeaf );
    }
    return aArea;
}